

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O0

void __thiscall CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CClass *stm)

{
  bool bVar1;
  element_type *peVar2;
  ClassInfo *this_00;
  pointer pCVar3;
  VariablesInfo *pVVar4;
  pointer pCVar5;
  element_type *peVar6;
  element_type *peVar7;
  pointer pCVar8;
  shared_ptr<VariablesInfo> local_58;
  shared_ptr<VariablesInfo> local_48 [2];
  shared_ptr<ClassInfo> local_28;
  CClass *local_18;
  CClass *stm_local;
  CConstructSymbolTableVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CClass *)this;
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::__cxx11::string::operator=((string *)&peVar2->iName,"");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->id);
  if (bVar1) {
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&local_18->id);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
  }
  this_00 = (ClassInfo *)operator_new(0x88);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  ClassInfo::ClassInfo(this_00,&peVar2->iName);
  std::shared_ptr<ClassInfo>::shared_ptr<ClassInfo,void>(&local_28,this_00);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<ClassInfo>::operator=(&peVar2->iClass,&local_28);
  std::shared_ptr<ClassInfo>::~shared_ptr(&local_28);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->parentClass);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->info);
    std::__cxx11::string::operator=((string *)&peVar2->iName,"");
    pCVar3 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                       (&local_18->parentClass);
    (**(pCVar3->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar3,this);
    peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->info);
    peVar6 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->info);
    peVar7 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        peVar6);
    std::__cxx11::string::operator=((string *)&peVar7->baseClass,(string *)&peVar2->iName);
  }
  pVVar4 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar4);
  std::shared_ptr<VariablesInfo>::shared_ptr<VariablesInfo,void>(local_48,pVVar4);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<VariablesInfo>::operator=(&peVar2->iVariables,local_48);
  std::shared_ptr<VariablesInfo>::~shared_ptr(local_48);
  pVVar4 = (VariablesInfo *)operator_new(0x50);
  VariablesInfo::VariablesInfo(pVVar4);
  std::shared_ptr<VariablesInfo>::shared_ptr<VariablesInfo,void>(&local_58,pVVar4);
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  std::shared_ptr<VariablesInfo>::operator=(&peVar2->definedVariables,&local_58);
  std::shared_ptr<VariablesInfo>::~shared_ptr(&local_58);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->fields);
  if (bVar1) {
    pCVar5 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->
                       (&local_18->fields);
    (**(pCVar5->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
  }
  peVar2 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar6 = std::__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<FullInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->info);
  peVar7 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      peVar6);
  std::shared_ptr<VariablesInfo>::operator=(&peVar7->fields,&peVar2->iVariables);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->methods);
  if (bVar1) {
    pCVar8 = std::unique_ptr<CMethodList,_std::default_delete<CMethodList>_>::operator->
                       (&local_18->methods);
    (**(pCVar8->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar8,this);
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CClass &stm )
{
//	std::cout << "class\n";
	info->iName = "";
	if( stm.id ) {
		stm.id->Accept( *this );
	}
	info->iClass = std::shared_ptr<ClassInfo>( new ClassInfo( info->iName ) );

	if( stm.parentClass ) {
		info->iName = "";
		stm.parentClass->Accept( *this );
		info->iClass->baseClass = info->iName;
	}

	info->iVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
    info->definedVariables = std::shared_ptr<VariablesInfo>( new VariablesInfo() );
	if( stm.fields ) {
		stm.fields->Accept( *this );
	}
	info->iClass->fields = info->iVariables;

	if( stm.methods ) {
		stm.methods->Accept( *this );
	}
}